

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  short sVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  uint uVar17;
  long in_FS_OFFSET;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar17 = j->code_buffer;
  uVar8 = (ulong)hdc->fast[uVar17 >> 0x17];
  if (uVar8 == 0xff) {
    lVar16 = 0;
    do {
      lVar14 = lVar16;
      lVar16 = lVar14 + 1;
    } while (hdc->maxcode[lVar14 + 10] <= uVar17 >> 0x10);
    iVar5 = j->code_bits;
    if (lVar16 != 8) {
      pcVar15 = "bad huffman code";
      if ((iVar5 < (int)(lVar14 + 10)) ||
         (uVar7 = (uVar17 >> (0x17U - (char)lVar16 & 0x1f) & stbi__bmask[lVar14 + 10]) +
                  hdc->delta[lVar14 + 10], 0xff < uVar7)) goto LAB_001266ee;
      uVar8 = (ulong)uVar7;
      if ((uVar17 >> (-hdc->size[uVar8] & 0x1f) & stbi__bmask[hdc->size[uVar8]]) !=
          (uint)hdc->code[uVar8]) {
LAB_00126a4b:
        __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                      ,0x85a,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
      }
      j->code_bits = (iVar5 - (int)lVar16) + -9;
      j->code_buffer = uVar17 << ((byte)(lVar14 + 10) & 0x1f);
      goto LAB_001265a8;
    }
LAB_001266de:
    j->code_bits = iVar5 + -0x10;
  }
  else {
    bVar1 = hdc->size[uVar8];
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar17 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
LAB_001265a8:
      bVar1 = hdc->values[uVar8];
      pcVar15 = "bad huffman code";
      if (0xf < bVar1) goto LAB_001266ee;
      data[0x38] = 0;
      data[0x39] = 0;
      data[0x3a] = 0;
      data[0x3b] = 0;
      data[0x3c] = 0;
      data[0x3d] = 0;
      data[0x3e] = 0;
      data[0x3f] = 0;
      data[0x30] = 0;
      data[0x31] = 0;
      data[0x32] = 0;
      data[0x33] = 0;
      data[0x34] = 0;
      data[0x35] = 0;
      data[0x36] = 0;
      data[0x37] = 0;
      data[0x28] = 0;
      data[0x29] = 0;
      data[0x2a] = 0;
      data[0x2b] = 0;
      data[0x2c] = 0;
      data[0x2d] = 0;
      data[0x2e] = 0;
      data[0x2f] = 0;
      data[0x20] = 0;
      data[0x21] = 0;
      data[0x22] = 0;
      data[0x23] = 0;
      data[0x24] = 0;
      data[0x25] = 0;
      data[0x26] = 0;
      data[0x27] = 0;
      data[0x18] = 0;
      data[0x19] = 0;
      data[0x1a] = 0;
      data[0x1b] = 0;
      data[0x1c] = 0;
      data[0x1d] = 0;
      data[0x1e] = 0;
      data[0x1f] = 0;
      data[0x10] = 0;
      data[0x11] = 0;
      data[0x12] = 0;
      data[0x13] = 0;
      data[0x14] = 0;
      data[0x15] = 0;
      data[0x16] = 0;
      data[0x17] = 0;
      data[8] = 0;
      data[9] = 0;
      data[10] = 0;
      data[0xb] = 0;
      data[0xc] = 0;
      data[0xd] = 0;
      data[0xe] = 0;
      data[0xf] = 0;
      data[0] = 0;
      data[1] = 0;
      data[2] = 0;
      data[3] = 0;
      data[4] = 0;
      data[5] = 0;
      data[6] = 0;
      data[7] = 0;
      uVar17 = 0;
      if (bVar1 != 0) {
        iVar5 = j->code_bits;
        if (iVar5 < (int)(uint)bVar1) {
          stbi__grow_buffer_unsafe(j);
          iVar5 = j->code_bits;
        }
        uVar17 = 0;
        if ((int)(uint)bVar1 <= iVar5) {
          uVar17 = j->code_buffer;
          uVar9 = uVar17 << (bVar1 & 0x1f) | uVar17 >> 0x20 - (bVar1 & 0x1f);
          uVar7 = stbi__bmask[bVar1];
          j->code_buffer = ~uVar7 & uVar9;
          j->code_bits = iVar5 - (uint)bVar1;
          iVar5 = 0;
          if (-1 < (int)uVar17) {
            iVar5 = stbi__jbias[bVar1];
          }
          uVar17 = iVar5 + (uVar9 & uVar7);
        }
      }
      uVar7 = j->img_comp[b].dc_pred;
      if (-1 < (int)(uVar7 ^ uVar17)) {
        bVar3 = (int)(uVar17 ^ 0x7fffffff) < (int)uVar7;
        if ((int)(uVar7 & uVar17) < 0) {
          bVar3 = (int)uVar7 < (int)(-0x80000000 - uVar17);
        }
        if (bVar3) {
          pcVar15 = "bad delta";
          goto LAB_001266ee;
        }
      }
      j->img_comp[b].dc_pred = uVar7 + uVar17;
      uVar2 = *dequant;
      uVar6 = (ushort)(uVar7 + uVar17);
      if ((ushort)(uVar2 + 1) < 2) {
LAB_001267f5:
        *data = uVar2 * uVar6;
        iVar10 = j->code_bits;
        iVar11 = 1;
        do {
          if (iVar10 < 0x10) {
            stbi__grow_buffer_unsafe(j);
          }
          uVar17 = j->code_buffer;
          uVar8 = (ulong)(uVar17 >> 0x17);
          uVar2 = fac[uVar8];
          if (uVar2 == 0) {
            if (j->code_bits < 0x10) {
              stbi__grow_buffer_unsafe(j);
              uVar17 = j->code_buffer;
              uVar8 = (ulong)(uVar17 >> 0x17);
            }
            uVar8 = (ulong)hac->fast[uVar8];
            if (uVar8 == 0xff) {
              lVar16 = 0;
              do {
                lVar14 = lVar16;
                lVar16 = lVar14 + 1;
              } while (hac->maxcode[lVar14 + 10] <= uVar17 >> 0x10);
              iVar5 = j->code_bits;
              if (lVar16 == 8) goto LAB_001266de;
              if ((iVar5 < (int)(lVar14 + 10)) ||
                 (uVar7 = (uVar17 >> (0x17U - (char)lVar16 & 0x1f) & stbi__bmask[lVar14 + 10]) +
                          hac->delta[lVar14 + 10], 0xff < uVar7)) goto LAB_001266e7;
              uVar8 = (ulong)uVar7;
              if ((uVar17 >> (-hac->size[uVar8] & 0x1f) & stbi__bmask[hac->size[uVar8]]) !=
                  (uint)hac->code[uVar8]) goto LAB_00126a4b;
              iVar10 = (iVar5 - (int)lVar16) + -9;
              j->code_bits = (iVar5 - (int)lVar16) + -9;
              j->code_buffer = uVar17 << ((byte)(lVar14 + 10) & 0x1f);
            }
            else {
              bVar1 = hac->size[uVar8];
              iVar10 = j->code_bits - (uint)bVar1;
              if (j->code_bits < (int)(uint)bVar1) goto LAB_001266e7;
              j->code_buffer = uVar17 << (bVar1 & 0x1f);
              j->code_bits = iVar10;
            }
            bVar1 = hac->values[uVar8];
            uVar17 = bVar1 & 0xf;
            if ((bVar1 & 0xf) == 0) {
              if (bVar1 != 0xf0) {
                return 1;
              }
              iVar11 = iVar11 + 0x10;
            }
            else {
              lVar16 = (long)iVar11 + (ulong)(bVar1 >> 4);
              bVar1 = ""[lVar16];
              if (iVar10 < (int)uVar17) {
                stbi__grow_buffer_unsafe(j);
                iVar10 = j->code_bits;
              }
              sVar4 = 0;
              sVar12 = 0;
              if ((int)uVar17 <= iVar10) {
                uVar7 = j->code_buffer;
                uVar13 = uVar7 << (sbyte)uVar17 | uVar7 >> 0x20 - (sbyte)uVar17;
                uVar9 = *(uint *)((long)stbi__bmask + (ulong)(uVar17 << 2));
                j->code_buffer = ~uVar9 & uVar13;
                j->code_bits = iVar10 - uVar17;
                if (-1 < (int)uVar7) {
                  sVar4 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar17 << 2));
                }
                sVar12 = ((ushort)uVar13 & (ushort)uVar9) + sVar4;
                iVar10 = iVar10 - uVar17;
              }
              iVar11 = (int)lVar16 + 1;
              *(short *)((long)data + (ulong)((uint)bVar1 * 2)) =
                   sVar12 * *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
            }
          }
          else {
            uVar7 = uVar2 & 0xf;
            iVar10 = j->code_bits - uVar7;
            if (j->code_bits < (int)uVar7) goto LAB_001266e7;
            lVar16 = (long)iVar11 + (ulong)(uVar2 >> 4 & 0xf);
            j->code_buffer = uVar17 << (sbyte)uVar7;
            j->code_bits = iVar10;
            iVar11 = (int)lVar16 + 1;
            *(short *)((long)data + (ulong)((uint)""[lVar16] * 2)) =
                 (short)(char)(uVar2 >> 8) *
                 *(short *)((long)dequant + (ulong)((uint)""[lVar16] * 2));
          }
          if (0x3f < iVar11) {
            return 1;
          }
        } while( true );
      }
      if (-1 < (short)(uVar2 ^ uVar6)) {
        if ((short)(0x7fff / (int)(short)uVar2) < (short)uVar6) {
          pcVar15 = "can\'t merge dc and ac";
          goto LAB_001266ee;
        }
        goto LAB_001267f5;
      }
      pcVar15 = "can\'t merge dc and ac";
      if ((short)uVar2 < 0) {
        if ((int)(short)uVar6 <= -0x8000 / (int)(short)uVar2) goto LAB_001267f5;
      }
      else if (-0x8000 / (int)(short)uVar2 <= (int)(short)uVar6) goto LAB_001267f5;
      goto LAB_001266ee;
    }
  }
LAB_001266e7:
  pcVar15 = "bad huffman code";
LAB_001266ee:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar15;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta","Corrupt JPEG");
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   if (!stbi__mul2shorts_valid(dc, dequant[0])) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         if (s > j->code_bits) return stbi__err("bad huffman code", "Combined length longer than code bits available");
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}